

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness
          (DescriptorBuilder *this,EnumDescriptorProto *proto,EnumDescriptor *result)

{
  ushort *puVar1;
  string *psVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  size_t __n;
  size_type sVar5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  ctrl_t *pcVar6;
  anon_union_8_1_a8a14541_for_iterator_2 aVar7;
  int iVar8;
  pointer prVar9;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar10;
  slot_type *psVar11;
  ulong uVar12;
  pointer pcVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  string_view element_name;
  string_view element_name_00;
  EnumValueDescriptor *value;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
  insert_result;
  string stripped;
  PrefixRemover remover;
  anon_class_16_2_17ec71fb make_error;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  values;
  EnumValueDescriptor *local_108;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
  local_100;
  EnumDescriptorProto *local_e0;
  DescriptorBuilder *local_d8;
  long local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 *local_a8;
  ulong local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  EnumValueDescriptor **local_88;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
  *local_80;
  VoidPtr local_78;
  code *pcStack_70;
  VoidPtr local_68;
  code *pcStack_60;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  local_58;
  
  puVar1 = (ushort *)(result->all_names_).payload_;
  uVar15 = (ulong)*puVar1;
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  local_e0 = proto;
  local_d8 = this;
  if (uVar15 != 0) {
    lVar16 = -uVar15;
    do {
      if (*(char *)((long)puVar1 + lVar16 + -1) != '_') {
        std::__cxx11::string::push_back((char)&local_a8);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0);
  }
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  if (0 < result->value_count_) {
    local_e0 = (EnumDescriptorProto *)((long)&local_e0->field_0 + 8);
    lVar16 = 0;
    do {
      local_108 = result->values_ + lVar16;
      psVar2 = result->values_[lVar16].all_names_;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      uVar15 = psVar2->_M_string_length;
      local_d0 = lVar16;
      if (local_a0 == 0 || uVar15 == 0) {
        uVar12 = 0;
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        uVar12 = 0;
        do {
          if ((ulong)(byte)pcVar3[uVar12] != 0x5f) {
            if (absl::lts_20250127::ascii_internal::kToLower[(byte)pcVar3[uVar12]] !=
                local_a8[uVar14]) {
              local_100.first.ctrl_ = &local_100.second;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_100,pcVar3,pcVar3 + uVar15);
              goto LAB_00221698;
            }
            uVar14 = uVar14 + 1;
          }
          uVar12 = uVar12 + 1;
        } while ((uVar12 < uVar15) && (uVar14 < local_a0));
      }
      pcVar13 = pcVar3;
      if (local_a0 <= uVar14) {
        uVar14 = uVar12;
        if (uVar12 < uVar15) {
          do {
            uVar14 = uVar12;
            if (pcVar3[uVar12] != '_') break;
            uVar12 = uVar12 + 1;
            uVar14 = uVar15;
          } while (uVar15 != uVar12);
        }
        if (uVar14 != uVar15) {
          pcVar13 = pcVar3 + uVar14;
        }
      }
      local_100.first.ctrl_ = &local_100.second;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,pcVar13,pcVar3 + uVar15);
LAB_00221698:
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)&local_c8);
      aVar7 = local_100.first.field_1;
      pcVar6 = local_100.first.ctrl_;
      if (local_100.first.field_1.slot_ != (slot_type *)0x0) {
        psVar11 = (slot_type *)0x0;
        do {
          if (pcVar6[(long)psVar11] != '_') {
            std::__cxx11::string::push_back((char)&local_c8);
          }
          psVar11 = (slot_type *)((long)&(psVar11->value).first._M_dataplus._M_p + 1);
        } while (aVar7.slot_ != psVar11);
      }
      if ((bool *)local_100.first.ctrl_ != &local_100.second) {
        operator_delete(local_100.first.ctrl_,CONCAT71(local_100._17_7_,local_100.second) + 1);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
      ::try_emplace_impl<std::__cxx11::string_const&,google::protobuf::EnumValueDescriptor_const*&>
                (&local_100,&local_58,&local_c8,&local_108);
      if (local_100.second == false) {
        prVar9 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                 ::iterator::operator->(&local_100.first);
        puVar4 = (undefined8 *)
                 (prVar9->second->super_Message).super_MessageLite._internal_metadata_.ptr_;
        __n = puVar4[1];
        if (((__n != local_108->all_names_->_M_string_length) ||
            ((__n != 0 &&
             (iVar8 = bcmp((void *)*puVar4,(local_108->all_names_->_M_dataplus)._M_p,__n),
             iVar8 != 0)))) &&
           (prVar9 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                     ::iterator::operator->(&local_100.first),
           *(int *)((long)&(prVar9->second->super_Message).super_MessageLite._vptr_MessageLite + 4)
           != local_108->number_)) {
          local_88 = &local_108;
          local_80 = &local_100;
          if (((local_d8->pool_->deprecated_legacy_json_field_conflicts_ == false) &&
              ((result->options_->field_0)._impl_.deprecated_legacy_json_field_conflicts_ != true))
             || (result->file_->edition_ != EDITION_PROTO2)) {
            pcVar3 = local_108->all_names_[1]._M_dataplus._M_p;
            sVar5 = local_108->all_names_[1]._M_string_length;
            pVVar10 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                                ((RepeatedPtrFieldBase *)local_e0,(int)local_d0);
            pcStack_70 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
            ;
            local_78.obj = &local_88;
            make_error_01.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
            ;
            make_error_01.ptr_.obj = local_78.obj;
            element_name_00._M_str = pcVar3;
            element_name_00._M_len = sVar5;
            AddError(local_d8,element_name_00,&pVVar10->super_Message,NAME,make_error_01);
          }
          else {
            pcVar3 = local_108->all_names_[1]._M_dataplus._M_p;
            sVar5 = local_108->all_names_[1]._M_string_length;
            pVVar10 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                                ((RepeatedPtrFieldBase *)local_e0,(int)local_d0);
            pcStack_60 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
            ;
            local_68.obj = &local_88;
            make_error_00.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
            ;
            make_error_00.ptr_.obj = local_68.obj;
            element_name._M_str = pcVar3;
            element_name._M_len = sVar5;
            AddWarning(local_d8,element_name,&pVVar10->super_Message,NAME,make_error_00);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      lVar16 = local_d0 + 1;
    } while (lVar16 < result->value_count_);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::~raw_hash_set(&local_58);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckEnumValueUniqueness(
    const EnumDescriptorProto& proto, const EnumDescriptor* result) {

  // Check that enum labels are still unique when we remove the enum prefix from
  // values that have it.
  //
  // This will fail for something like:
  //
  //   enum MyEnum {
  //     MY_ENUM_FOO = 0;
  //     FOO = 1;
  //   }
  //
  // By enforcing this reasonable constraint, we allow code generators to strip
  // the prefix and/or PascalCase it without creating conflicts.  This can lead
  // to much nicer language-specific enums like:
  //
  //   enum NameType {
  //     FirstName = 1,
  //     LastName = 2,
  //   }
  //
  // Instead of:
  //
  //   enum NameType {
  //     NAME_TYPE_FIRST_NAME = 1,
  //     NAME_TYPE_LAST_NAME = 2,
  //   }
  PrefixRemover remover(result->name());
  absl::flat_hash_map<std::string, const EnumValueDescriptor*> values;
  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    std::string stripped =
        EnumValueToPascalCase(remover.MaybeRemove(value->name()));
    auto insert_result = values.try_emplace(stripped, value);
    bool inserted = insert_result.second;

    // We don't throw the error if the two conflicting symbols are identical, or
    // if they map to the same number.  In the former case, the normal symbol
    // duplication error will fire so we don't need to (and its error message
    // will make more sense). We allow the latter case so users can create
    // aliases which add or remove the prefix (code generators that do prefix
    // stripping should de-dup the labels in this case).
    if (!inserted && insert_result.first->second->name() != value->name() &&
        insert_result.first->second->number() != value->number()) {
      auto make_error = [&] {
        return absl::StrFormat(
            "Enum name %s has the same name as %s if you ignore case and strip "
            "out the enum name prefix (if any). (If you are using allow_alias, "
            "please assign the same number to each enum value name.)",
            value->name(), insert_result.first->second->name());
      };
      // There are proto2 enums out there with conflicting names, so to preserve
      // compatibility we issue only a warning for proto2.
      if ((pool_->deprecated_legacy_json_field_conflicts_ ||
           IsLegacyJsonFieldConflictEnabled(result->options())) &&
          result->file()->edition() == Edition::EDITION_PROTO2) {
        AddWarning(value->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NAME, make_error);
        continue;
      }
      AddError(value->full_name(), proto.value(i),
               DescriptorPool::ErrorCollector::NAME, make_error);
    }
  }
}